

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::RunStatementInternal
          (ClientContext *this,ClientContextLock *lock,string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,bool allow_stream_result,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          params,bool verify)

{
  pointer pcVar1;
  ErrorData *pEVar2;
  pointer pPVar3;
  type lock_00;
  pointer *__ptr;
  undefined7 in_register_00000081;
  undefined7 in_stack_00000009;
  __alloc_node_gen_t __alloc_node_gen;
  undefined1 local_f8 [16];
  element_type *local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  char local_a8 [16];
  _Alloc_hider local_98;
  char local_88 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_78;
  __node_base local_68;
  size_type local_60;
  _Prime_rehash_policy local_58;
  __node_base_ptr local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  local_40._1_7_ = in_stack_00000009;
  local_40._0_1_ = verify;
  local_38 = SUB81(params.ptr,0);
  local_f8._8_8_ = *(long *)CONCAT71(in_register_00000081,allow_stream_result);
  *(long *)CONCAT71(in_register_00000081,allow_stream_result) = 0;
  PendingQueryInternal
            ((ClientContext *)local_f8,lock,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             query,(PendingQueryParameters *)(local_f8 + 8),SUB81(&local_40,0));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_f8._8_8_)[1])();
  }
  local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pPVar3 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)local_f8);
  if ((pPVar3->super_BaseQueryResult).success == false) {
    pPVar3 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_f8);
    local_c0[0] = (pPVar3->super_BaseQueryResult).error.initialized;
    local_c0[1] = (pPVar3->super_BaseQueryResult).error.type;
    pcVar1 = (pPVar3->super_BaseQueryResult).error.raw_message._M_dataplus._M_p;
    local_b8._M_p = local_a8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar1,
               pcVar1 + (pPVar3->super_BaseQueryResult).error.raw_message._M_string_length);
    pcVar1 = (pPVar3->super_BaseQueryResult).error.final_message._M_dataplus._M_p;
    local_98._M_p = local_88;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar1,
               pcVar1 + (pPVar3->super_BaseQueryResult).error.final_message._M_string_length);
    local_78._vptr__Sp_counted_base = (_func_int **)0x0;
    local_78._8_8_ = (pPVar3->super_BaseQueryResult).error.extra_info._M_h._M_bucket_count;
    local_68._M_nxt = (_Hash_node_base *)0x0;
    local_60 = (pPVar3->super_BaseQueryResult).error.extra_info._M_h._M_element_count;
    pEVar2 = &(pPVar3->super_BaseQueryResult).error;
    local_58._M_max_load_factor = (pEVar2->extra_info)._M_h._M_rehash_policy._M_max_load_factor;
    local_58._4_4_ = *(undefined4 *)&(pEVar2->extra_info)._M_h._M_rehash_policy.field_0x4;
    local_58._M_next_resize =
         (pPVar3->super_BaseQueryResult).error.extra_info._M_h._M_rehash_policy._M_next_resize;
    local_48 = (__node_base_ptr)0x0;
    local_e0._M_dataplus._M_p = (pointer)&local_78;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_78,&(pPVar3->super_BaseQueryResult).error.extra_info._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)&local_e0);
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    ProcessError((ClientContext *)lock,(ErrorData *)local_c0,&local_e0);
    make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData>
              ((duckdb *)&local_e8,(ErrorData *)local_c0);
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_e8;
    local_e8 = (element_type *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_78);
    if (local_98._M_p != local_88) {
      operator_delete(local_98._M_p);
    }
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
  }
  else {
    lock_00 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              ::operator*((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_f8);
    PendingQueryResult::ExecuteInternal((PendingQueryResult *)this,(ClientContextLock *)lock_00);
  }
  if ((element_type *)local_f8._0_8_ != (element_type *)0x0) {
    (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                 &((BaseQueryResult *)local_f8._0_8_)->_vptr_BaseQueryResult)->internal).
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult>
ClientContext::RunStatementInternal(ClientContextLock &lock, const string &query, unique_ptr<SQLStatement> statement,
                                    bool allow_stream_result,
                                    optional_ptr<case_insensitive_map_t<BoundParameterData>> params, bool verify) {
	PendingQueryParameters parameters;
	parameters.allow_stream_result = allow_stream_result;
	parameters.parameters = params;
	auto pending = PendingQueryInternal(lock, std::move(statement), parameters, verify);
	if (pending->HasError()) {
		return ErrorResult<MaterializedQueryResult>(pending->GetErrorObject());
	}
	return ExecutePendingQueryInternal(lock, *pending);
}